

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_matrix *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *this;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out;
  PrimVar *this_00;
  pointer pSVar1;
  undefined8 this_01;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint32_t uVar5;
  value_type *pvVar6;
  value_type *value;
  ostream *poVar7;
  size_type sVar8;
  mapped_type *this_02;
  UsdPrimvarReader_matrix *pUVar9;
  UsdPrimvarReader_matrix *pUVar10;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar11;
  long lVar12;
  long lVar13;
  UsdPrimvarReader_matrix *args;
  ulong uVar14;
  string *psVar15;
  char *pcVar16;
  Property *pPVar17;
  storage_t<tinyusdz::value::matrix4d> *psVar18;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__lhs;
  _Rb_tree_header *p_Var19;
  byte bVar20;
  UsdPrimvarReader_matrix *pUStackY_6e0;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar21;
  allocator local_6c1;
  UsdPrimvarReader_matrix *local_6c0;
  string *local_6b8;
  UsdPrimvarReader_matrix *local_6b0;
  ParseResult ret;
  string attr_type_name;
  string local_638;
  undefined8 local_618;
  optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>> *local_610;
  undefined1 local_608 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ParseResult sret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  ostringstream ss_e_1;
  undefined1 local_508 [16];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_4f8 [7];
  string local_398 [32];
  optional<tinyusdz::value::matrix4d> pv;
  string local_2f0 [32];
  string local_2d0;
  optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> av;
  
  bVar20 = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pUVar10 = preader;
  local_6b8 = err;
  local_608._8_8_ = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  p_Var19 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  this = &preader->fallback;
  local_608._16_8_ = &(preader->fallback)._paths;
  local_610 = (optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>> *)
              &(preader->fallback)._attrib;
  out = &preader->varname;
  local_618 = &(preader->result)._actual_type_name;
  local_608._0_8_ = &(preader->super_ShaderNode).super_UsdShadePrim.props;
  local_6b0 = preader;
  for (pUVar9 = (UsdPrimvarReader_matrix *)
                (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pUVar9 != (UsdPrimvarReader_matrix *)p_Var19;
      pUVar9 = (UsdPrimvarReader_matrix *)::std::_Rb_tree_increment((_Rb_tree_node_base *)pUVar9)) {
    __lhs = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&(pUVar9->super_ShaderNode).super_UsdShadePrim.spec;
    ::std::__cxx11::string::string((string *)&local_530,(string *)__lhs);
    local_6c0 = (UsdPrimvarReader_matrix *)
                &(pUVar9->super_ShaderNode).super_UsdShadePrim.meta._kind_str;
    ::std::__cxx11::string::string((string *)&local_638,"inputs:fallback",&local_6c1);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar4 = ::std::__cxx11::string::compare((string *)&local_530);
    if (iVar4 == 0) {
      if (((undefined1  [32])(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.sceneName.contained
          & (undefined1  [32])0xfffffffe00000000) == (undefined1  [32])0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",(allocator *)&pv
                  );
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,&local_638,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar10);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (*(long *)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc !=
          *(long *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.contained +
                   0x28)) {
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_608._16_8_,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.contained +
                   0x28));
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)local_6c0);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var3) {
        ::std::__cxx11::string::_M_dispose();
LAB_001e20a2:
        iVar4 = *(int *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.sceneName.
                                contained + 4);
        pUVar10 = pUVar9;
        if (iVar4 == 1) {
          bVar2 = Attribute::is_blocked((Attribute *)local_6c0);
          if (bVar2) {
            (local_6b0->fallback)._blocked = true;
          }
          this_00 = (PrimVar *)
                    ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.assetInfo.contained.
                            data + 0x20);
          bVar2 = primvar::PrimVar::has_value(this_00);
          if ((bVar2) ||
             (*(long *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                               contained + 0x10) !=
              *(long *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                               contained + 8))) {
            av.has_value_ = false;
            av._1_7_ = 0x3ff00000000000;
            av.contained._16_8_ = 0;
            av.contained._24_8_ = 0;
            av.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            av.contained._8_8_ = 0;
            av.contained._32_8_ = 0x3ff0000000000000;
            av.contained._56_8_ = 0;
            av.contained._64_8_ = 0;
            av.contained._40_8_ = 0;
            av.contained._48_8_ = 0;
            av.contained._72_8_ = 0x3ff0000000000000;
            av.contained._96_8_ = 0;
            av.contained._104_8_ = 0;
            av.contained._80_8_ = 0;
            av.contained._88_8_ = 0;
            av.contained._112_8_ = 0x3ff0000000000000;
            av.contained._120_2_ = 0;
            av.contained._144_1_ = 0;
            av.contained._145_8_ = 0;
            av.contained._128_8_ = 0;
            av.contained._136_1_ = 0;
            av.contained._137_7_ = 0;
            bVar2 = primvar::PrimVar::is_valid(this_00);
            if (bVar2) {
              bVar2 = primvar::PrimVar::has_value(this_00);
              if (bVar2) {
                primvar::PrimVar::get_value<tinyusdz::value::matrix4d>
                          ((optional<tinyusdz::value::matrix4d> *)&sret,this_00);
                pv.has_value_ = (bool)(undefined1)sret.code;
                if ((undefined1)sret.code != Unmatched) goto LAB_001e2cfa;
                lVar13 = 0x10;
                psVar15 = &sret.err;
                psVar18 = &pv.contained;
                for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *(pointer *)psVar18 = (psVar15->_M_dataplus)._M_p;
                  psVar15 = (string *)((long)psVar15 + (ulong)bVar20 * -0x10 + 8);
                  psVar18 = (storage_t<tinyusdz::value::matrix4d> *)
                            ((long)psVar18 + (ulong)bVar20 * -0x10 + 8);
                }
                pvVar6 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value(&pv);
                pPVar17 = (Property *)&av;
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pPVar17->_attrib)._name._M_dataplus._M_p = (pointer)pvVar6->m[0][0];
                  pvVar6 = (value_type *)((long)pvVar6 + ((ulong)bVar20 * -2 + 1) * 8);
                  pPVar17 = (Property *)((long)pPVar17 + (ulong)bVar20 * -0x10 + 8);
                }
                av.contained._120_2_ = 1;
                pUStackY_6e0 = *(UsdPrimvarReader_matrix **)
                                ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.
                                        customData.contained + 8);
                pUVar10 = *(UsdPrimvarReader_matrix **)
                           ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                   contained + 0x10);
                if (pUVar10 != pUStackY_6e0) goto LAB_001e2d1a;
              }
              else {
LAB_001e2cfa:
                pUStackY_6e0 = *(UsdPrimvarReader_matrix **)
                                ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.
                                        customData.contained + 8);
                pUVar10 = *(UsdPrimvarReader_matrix **)
                           ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                   contained + 0x10);
                if (pUVar10 == pUStackY_6e0) {
                  _ss_e_1 = _ss_e_1 & 0xffffff00;
                  pTVar21 = __lhs;
                  memset(local_508,0,0xa8);
                  pUVar10 = pUStackY_6e0;
                  goto LAB_001e235e;
                }
LAB_001e2d1a:
                lVar13 = 0;
                uVar14 = 0;
                while( true ) {
                  lVar12 = (long)pUVar10 - (long)pUStackY_6e0;
                  pUStackY_6e0 = (UsdPrimvarReader_matrix *)0x28;
                  pUVar10 = (UsdPrimvarReader_matrix *)0x28;
                  if ((ulong)(lVar12 / 0x28) <= uVar14) break;
                  pvVar11 = tinyusdz::value::TimeSamples::get_samples
                                      ((TimeSamples *)
                                       ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.
                                               customData.contained + 8));
                  pSVar1 = (pvVar11->
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((&pSVar1->blocked)[lVar13] == true) {
                    TypedTimeSamples<tinyusdz::value::matrix4d>::add_blocked_sample
                              ((TypedTimeSamples<tinyusdz::value::matrix4d> *)
                               ((long)&av.contained + 0x80),*(double *)((long)&pSVar1->t + lVar13));
                  }
                  else {
                    tinyusdz::value::Value::get_value<tinyusdz::value::matrix4d>
                              ((optional<tinyusdz::value::matrix4d> *)&sret,
                               (Value *)((long)&(pSVar1->value).v_.storage + lVar13),false);
                    pv.has_value_ = (bool)(undefined1)sret.code;
                    if ((undefined1)sret.code != Unmatched) {
                      _ss_e_1 = _ss_e_1 & 0xffffff00;
                      memset(local_508,0,0xa8);
                      pTVar21 = __lhs;
                      goto LAB_001e235e;
                    }
                    psVar15 = &sret.err;
                    psVar18 = &pv.contained;
                    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
                      *(pointer *)psVar18 = (psVar15->_M_dataplus)._M_p;
                      psVar15 = (string *)((long)psVar15 + (ulong)bVar20 * -0x10 + 8);
                      psVar18 = (storage_t<tinyusdz::value::matrix4d> *)
                                ((long)psVar18 + (ulong)bVar20 * -0x10 + 8);
                    }
                    local_608._24_8_ = *(double *)((long)&pSVar1->t + lVar13);
                    pvVar6 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value(&pv);
                    TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
                              ((TypedTimeSamples<tinyusdz::value::matrix4d> *)
                               ((long)&av.contained + 0x80),(double)local_608._24_8_,pvVar6);
                  }
                  uVar14 = uVar14 + 1;
                  pUStackY_6e0 = *(UsdPrimvarReader_matrix **)
                                  ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.
                                          customData.contained + 8);
                  pUVar10 = *(UsdPrimvarReader_matrix **)
                             ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                     contained + 0x10);
                  lVar13 = lVar13 + 0x28;
                }
              }
              pTVar21 = __lhs;
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
              optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>,_0>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *)&ss_e_1,
                         (Animatable<tinyusdz::value::matrix4d> *)&av);
              pUVar10 = pUStackY_6e0;
            }
            else {
              _ss_e_1 = _ss_e_1 & 0xffffff00;
              memset(local_508,0,0xa8);
              pTVar21 = __lhs;
            }
LAB_001e235e:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                             *)((long)&av.contained + 0x80));
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
            optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>,_0>
                      (&av,(optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
            ~optional((optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *)&ss_e_1);
            bVar2 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::
              operator=(local_610,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
            ~optional(&av);
            if (bVar2 != false) {
              AttrMetas::operator=
                        (&this->_metas,
                         (AttrMetas *)
                         ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                         8));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_638);
              ret.code = Success;
            }
          }
          else {
            pTVar21 = __lhs;
            if (*(long *)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc !=
                *(long *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                 contained + 0x28)) {
              AttrMetas::operator=
                        (&this->_metas,
                         (AttrMetas *)
                         ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                         8));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_530);
              ret.code = Success;
            }
          }
        }
        else {
          pTVar21 = __lhs;
          if (iVar4 == 0) {
            (local_6b0->fallback)._value_empty = true;
            AttrMetas::operator=
                      (&this->_metas,
                       (AttrMetas *)
                       ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 8)
                      );
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_638);
            ret.code = Success;
          }
          else {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InternalError;
          }
        }
      }
      else {
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::underlying_type_name_abi_cxx11_();
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var3) goto LAB_001e20a2;
        ret.code = TypeMismatch;
        pTVar21 = __lhs;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar7 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ");
        poVar7 = ::std::operator<<(poVar7,(string *)&local_638);
        poVar7 = ::std::operator<<(poVar7," expects type `");
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
        poVar7 = ::std::operator<<(poVar7,(string *)&ss_e_1);
        poVar7 = ::std::operator<<(poVar7,"` but defined as type `");
        poVar7 = ::std::operator<<(poVar7,(string *)&attr_type_name);
        ::std::operator<<(poVar7,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
      pTVar21 = __lhs;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      iVar4 = 3;
LAB_001e2564:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar7 = ::std::operator<<((ostream *)&av,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructShader");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x120a);
        ::std::operator<<(poVar7," ");
        ::std::__cxx11::string::string
                  ((string *)&pv,"Parsing attribute `{}` failed. Error: {}",(allocator *)&sret);
        pUVar10 = (UsdPrimvarReader_matrix *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&pv,(string *)"inputs:fallback",(char (*) [16])pUVar10,
                   warn);
        poVar7 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar15 = local_6b8;
        if (local_6b8 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar15);
          ::std::__cxx11::string::operator=((string *)psVar15,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        iVar4 = 1;
        goto LAB_001e2564;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&av,"inputs:varname",(allocator *)&ss_e_1);
        sVar8 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&av);
        ::std::__cxx11::string::_M_dispose();
        if (sVar8 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::string((string *)&local_2d0,(string *)__lhs);
          ::std::__cxx11::string::string((string *)&ss_e_1,"inputs:varname",(allocator *)&sret);
          pUVar10 = local_6c0;
          warn = (string *)&ss_e_1;
          err = (string *)&av;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)&pv,&table,&local_2d0,(Property *)local_6c0,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (pv._0_4_ == 3) {
            ::std::__cxx11::string::string(local_2f0,(string *)__lhs);
            ::std::__cxx11::string::string((string *)&ss_e_1,"inputs:varname",(allocator *)&ret);
            pUVar10 = local_6c0;
            warn = (string *)&ss_e_1;
            err = (string *)out;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      (&sret,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f0,(string *)local_6c0,(Property *)&ss_e_1,(string *)out,pTVar21);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar4 = 3;
            if (sret.code != Success) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar7 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructShader");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1223);
              ::std::operator<<(poVar7," ");
              ::std::__cxx11::string::string
                        ((string *)&attr_type_name,"Faied to parse inputs:varname: {}",
                         (allocator *)&local_638);
              fmt::format<std::__cxx11::string>
                        ((string *)&ret,(fmt *)&attr_type_name,(string *)&sret.err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pUVar10);
              poVar7 = ::std::operator<<((ostream *)&ss_e_1,(string *)&ret);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar15 = local_6b8;
              __lhs = pTVar21;
              if (local_6b8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&attr_type_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar15);
                ::std::__cxx11::string::operator=((string *)psVar15,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                __lhs = pTVar21;
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar4 = 1;
              pTVar21 = __lhs;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar4 = 0;
            if (pv._0_4_ == 0) {
              bVar2 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av,out);
              iVar4 = 3;
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar7 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReconstructShader");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1211);
                ::std::operator<<(poVar7," ");
                poVar7 = ::std::operator<<((ostream *)&ss_e_1,
                                           "Failed to convert inputs:varname token type to string type."
                                          );
                ::std::operator<<(poVar7,"\n");
                psVar15 = local_6b8;
                __lhs = pTVar21;
                if (local_6b8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&sret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar15);
                  ::std::__cxx11::string::operator=((string *)psVar15,(string *)&sret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  __lhs = pTVar21;
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar4 = 1;
                pTVar21 = __lhs;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          if (iVar4 != 0) goto LAB_001e2cdb;
        }
      }
      ::std::__cxx11::string::string(local_398,(string *)__lhs);
      ::std::__cxx11::string::string((string *)&attr_type_name,"outputs:result",&local_6c1);
      local_508._0_8_ = local_4f8;
      local_508._8_8_ = 0;
      local_4f8[0]._0_1_ = '\0';
      iVar4 = ::std::__cxx11::string::compare(local_398);
      if (iVar4 == 0) {
        __lhs = pTVar21;
        sVar8 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,&attr_type_name);
        args = (UsdPrimvarReader_matrix *)&ret;
        if (sVar8 == 0) {
          bVar2 = Property::is_attribute_connection((Property *)local_6c0);
          if (bVar2) {
            _ss_e_1 = 5;
            ::std::__cxx11::string::assign(local_508);
          }
          else if (*(int *)((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.sceneName.
                                   contained + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)&av,(Attribute *)local_6c0);
            bVar2 = tinyusdz::value::IsRoleType((string *)&av);
            tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&av);
            ::std::__cxx11::string::_M_dispose();
            if (_Var3) {
              (local_6b0->result)._authored = true;
              AttrMetas::operator=
                        (&(preader->result)._metas,
                         (AttrMetas *)
                         ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                         8));
LAB_001e2ebc:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&attr_type_name);
              _ss_e_1 = 0;
              args = pUVar10;
            }
            else {
              if (bVar2) {
                uVar5 = tinyusdz::value::GetUnderlyingTypeId((string *)&av);
                if (uVar5 == 0x38) {
                  (local_6b0->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)local_618);
                  AttrMetas::operator=
                            (&(preader->result)._metas,
                             (AttrMetas *)
                             ((long)&(pUVar9->super_ShaderNode).super_UsdShadePrim.meta.doc.
                                     contained + 8));
                  goto LAB_001e2ebc;
                }
                pcVar16 = 
                "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                ;
              }
              else {
                pcVar16 = "Property type mismatch. {} expects type `{}` but defined as type `{}`.";
              }
              _ss_e_1 = 3;
              ::std::__cxx11::string::string((string *)&sret,pcVar16,(allocator *)&local_638);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
              warn = (string *)&av;
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&pv,(fmt *)&sret,&attr_type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av,
                         err);
              ::std::__cxx11::string::operator=((string *)local_508,(string *)&pv);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
            pUVar10 = args;
          }
          else {
            ::std::__cxx11::string::assign(local_508);
            _ss_e_1 = 6;
          }
        }
        else {
          _ss_e_1 = 2;
        }
      }
      else {
        _ss_e_1 = 1;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_001e2b69:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar7 = ::std::operator<<((ostream *)&av,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructShader");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1229);
          ::std::operator<<(poVar7," ");
          ::std::__cxx11::string::string
                    ((string *)&sret,"Parsing shader output property `{}` failed. Error: {}",
                     (allocator *)&ret);
          pUVar10 = (UsdPrimvarReader_matrix *)local_508;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&pv,(fmt *)&sret,(string *)"outputs:result",(char (*) [15])pUVar10,
                     warn);
          poVar7 = ::std::operator<<((ostream *)&av,(string *)&pv);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar15 = local_6b8;
          if (local_6b8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sret,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar15);
            ::std::__cxx11::string::operator=((string *)psVar15,(string *)&pv);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar4 = 1;
          goto LAB_001e2b69;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001e2cdb;
      sVar8 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar8 == 0) {
        this_02 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                *)local_608._0_8_,(key_type *)__lhs);
        Property::operator=(this_02,(Property *)local_6c0);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar8 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar8 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar7 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructShader");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x122b);
        ::std::operator<<(poVar7," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar7 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::_M_dispose();
        this_01 = local_608._8_8_;
        if ((anon_struct_8_0_00000001_for___align)local_608._8_8_ !=
            (anon_struct_8_0_00000001_for___align)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6b8);
          ::std::__cxx11::string::operator=((string *)this_01,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001e2cdb:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return pUVar9 == (UsdPrimvarReader_matrix *)p_Var19;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_matrix>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_matrix *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_matrix,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_matrix, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_matrix, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}